

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synapse.cpp
# Opt level: O1

void __thiscall indk::Neuron::Synapse::Synapse(Synapse *this)

{
  Position *this_00;
  
  (this->GammaQ).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->GammaQ).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->GammaQ).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = (Position *)operator_new(0x10);
  Position::Position(this_00);
  this->SPos = this_00;
  this->ok1 = 0.0;
  this->ok2 = 0.0;
  this->k1 = 0.0;
  this->k2 = 0.0;
  this->Lambda = 0.0;
  this->Tl = 0;
  this->Gamma = 0.0;
  this->dGamma = 0.0;
  this->QCounter = -1;
  LOCK();
  (this->QSize).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

indk::Neuron::Synapse::Synapse() {
    SPos = new indk::Position();
    ok1 = 0;
    ok2 = 0;
    k1 = 0;
    k2 = 0;
    Lambda = 0;
    Tl = 0;
    Gamma = 0;
    dGamma = 0;
    QCounter = -1;
    QSize = 0;
}